

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pnext_chain
          (Impl *this,Value *pnext,void **outpNext,StateCreatorInterface *iface,
          DatabaseInterface *resolver,Value *pipelines)

{
  VkStructureType VVar1;
  VkSamplerYcbcrConversionCreateInfo *pVVar2;
  bool bVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  VkSamplerYcbcrConversionCreateInfo *pVVar6;
  VkSamplerYcbcrConversionCreateInfo *pVVar7;
  VkSamplerYcbcrConversionCreateInfo *pVVar8;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  long *in_FS_OFFSET;
  VkPipelineDiscardRectangleStateCreateInfoEXT *discard_rectangles;
  VkSamplerYcbcrConversionCreateInfo *local_68;
  Impl *local_60;
  char local_51;
  StateCreatorInterface *local_50;
  Value *local_48;
  DatabaseInterface *local_40;
  void **local_38;
  
  local_60 = this;
  local_40 = resolver;
  if ((pnext->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(pnext->data_).s.str & 0xffffffffffff);
  local_38 = outpNext;
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(pnext);
  if (pGVar4 == this_00) {
    pVVar7 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
  }
  else {
    local_51 = pipelines != (Value *)0x0 && iface != (StateCreatorInterface *)0x0;
    pVVar6 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
    pVVar8 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
    local_50 = iface;
    local_48 = pipelines;
    do {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"sType");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) {
        __assert_fail("data_.f.flags & kIntFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x718,
                      "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      VVar1 = (pGVar5->data_).s.length;
      if ((int)VVar1 < 0x3b9e3cd1) {
        if ((int)VVar1 < 0x3b9cf898) {
          if ((int)VVar1 < 0x3b9c5489) {
            if ((int)VVar1 < 0x3b9b9908) {
              if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
                local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
                parse_rasterization_stream_state
                          (local_60,(Value *)this_00,
                           (VkPipelineRasterizationStateStreamCreateInfoEXT **)&local_68);
              }
              else {
                if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
LAB_0011e971:
                  if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
                    return false;
                  }
                  bVar3 = Internal::log_thread_callback
                                    (LOG_ERROR,"Failed to parse pNext chain for sType: %d\n",
                                     (ulong)VVar1);
                  if (!bVar3) {
                    fprintf(_stderr,"Fossilize ERROR: Failed to parse pNext chain for sType: %d\n",
                            (ulong)VVar1);
                    return false;
                  }
                  return false;
                }
                local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
                parse_pipeline_rendering_info
                          (local_60,(Value *)this_00,(VkPipelineRenderingCreateInfoKHR **)&local_68)
                ;
              }
            }
            else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_multiview_state
                        (local_60,(Value *)this_00,(VkRenderPassMultiviewCreateInfo **)&local_68);
            }
            else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_pipeline_robustness
                        (local_60,(Value *)this_00,(VkPipelineRobustnessCreateInfoEXT **)&local_68);
            }
            else {
              if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT)
              goto LAB_0011e971;
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_discard_rectangles
                        (local_60,(Value *)this_00,
                         (VkPipelineDiscardRectangleStateCreateInfoEXT **)&local_68);
            }
          }
          else if ((int)VVar1 < 0x3b9c9309) {
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT
               ) {
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_rasterization_conservative_state
                        (local_60,(Value *)this_00,
                         (VkPipelineRasterizationConservativeStateCreateInfoEXT **)&local_68);
            }
            else {
              if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT
                 ) goto LAB_0011e971;
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_rasterization_depth_clip_state
                        (local_60,(Value *)this_00,
                         (VkPipelineRasterizationDepthClipStateCreateInfoEXT **)&local_68);
            }
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_input_attachment_aspect
                      (local_60,(Value *)this_00,
                       (VkRenderPassInputAttachmentAspectCreateInfo **)&local_68);
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO)
          {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_tessellation_domain_origin_state
                      (local_60,(Value *)this_00,
                       (VkPipelineTessellationDomainOriginStateCreateInfo **)&local_68);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_sampler_reduction_mode
                      (local_60,(Value *)this_00,(VkSamplerReductionModeCreateInfo **)&local_68);
          }
        }
        else if ((int)VVar1 < 0x3b9db031) {
          if ((int)VVar1 < 0x3b9d0c22) {
            if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_sample_locations_info
                        (local_60,(Value *)this_00,(VkSampleLocationsInfoEXT **)&local_68);
            }
            else {
              if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT)
              goto LAB_0011e971;
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_sample_locations
                        (local_60,(Value *)this_00,
                         (VkPipelineSampleLocationsStateCreateInfoEXT **)&local_68);
            }
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_color_blend_advanced_state
                      (local_60,(Value *)this_00,
                       (VkPipelineColorBlendAdvancedStateCreateInfoEXT **)&local_68);
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_sampler_ycbcr_conversion(local_60,(Value *)this_00,&local_68);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO)
            goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_descriptor_set_binding_flags
                      (local_60,(Value *)this_00,
                       (VkDescriptorSetLayoutBindingFlagsCreateInfoEXT **)&local_68);
          }
        }
        else if ((int)VVar1 < 0x3b9e1d92) {
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_vertex_input_divisor_state
                      (local_60,(Value *)this_00,
                       (VkPipelineVertexInputDivisorStateCreateInfoKHR **)&local_68);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE)
            goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            bVar3 = parse_subpass_description_depth_stencil_resolve
                              (local_60,(Value *)this_00,
                               (VkSubpassDescriptionDepthStencilResolve **)&local_68);
LAB_0011e5e1:
            if (bVar3 == false) {
              return false;
            }
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_render_pass_fragment_density_map
                    (local_60,(Value *)this_00,
                     (VkRenderPassFragmentDensityMapCreateInfoEXT **)&local_68);
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
            if (VVar1 != VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR)
            goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            bVar3 = parse_fragment_shading_rate_attachment_info
                              (local_60,(Value *)this_00,
                               (VkFragmentShadingRateAttachmentInfoKHR **)&local_68);
            goto LAB_0011e5e1;
          }
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_shader_stage_required_subgroup_size
                    (local_60,(Value *)this_00,
                     (VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT **)&local_68);
        }
      }
      else if ((int)VVar1 < 0x3b9f9490) {
        if ((int)VVar1 < 0x3b9eaa31) {
          if ((int)VVar1 < 0x3b9e5442) {
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_fragment_shading_rate
                        (local_60,(Value *)this_00,
                         (VkPipelineFragmentShadingRateStateCreateInfoKHR **)&local_68);
            }
            else {
              if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) goto LAB_0011e971;
              local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
              parse_rendering_attachment_location_info
                        (local_60,(Value *)this_00,
                         (VkRenderingAttachmentLocationInfoKHR **)&local_68);
            }
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_rendering_input_attachment_index_info
                      (local_60,(Value *)this_00,
                       (VkRenderingInputAttachmentIndexInfoKHR **)&local_68);
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_attachment_reference_stencil_layout
                      (local_60,(Value *)this_00,(VkAttachmentReferenceStencilLayout **)&local_68);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_attachment_description_stencil_layout
                      (local_60,(Value *)this_00,(VkAttachmentDescriptionStencilLayout **)&local_68)
            ;
          }
        }
        else if ((int)VVar1 < 0x3b9f1b7a) {
          if (VVar1 == 
              VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_provoking_vertex
                      (local_60,(Value *)this_00,
                       (VkPipelineRasterizationProvokingVertexStateCreateInfoEXT **)&local_68);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO)
            goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_rasterization_line_state
                      (local_60,(Value *)this_00,
                       (VkPipelineRasterizationLineStateCreateInfoKHR **)&local_68);
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_depth_bias_representation
                    (local_60,(Value *)this_00,(VkDepthBiasRepresentationInfoEXT **)&local_68);
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            if (local_51 == '\0') {
              return false;
            }
            bVar3 = parse_pipeline_library
                              (local_60,local_50,local_40,local_48,(Value *)this_00,
                               RESOURCE_GRAPHICS_PIPELINE,
                               (VkPipelineLibraryCreateInfoKHR **)&local_68);
            goto LAB_0011e5e1;
          }
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_sampler_custom_border_color
                    (local_60,(Value *)this_00,(VkSamplerCustomBorderColorCreateInfoEXT **)&local_68
                    );
        }
      }
      else if ((int)VVar1 < 0x3ba09a49) {
        if ((int)VVar1 < 0x3ba0251a) {
          if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_memory_barrier2(local_60,(Value *)this_00,(VkMemoryBarrier2KHR **)&local_68);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT)
            goto LAB_0011e971;
            local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
            parse_graphics_pipeline_library
                      (local_60,(Value *)this_00,
                       (VkGraphicsPipelineLibraryCreateInfoEXT **)&local_68);
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_mutable_descriptor_type
                    (local_60,(Value *)this_00,(VkMutableDescriptorTypeCreateInfoEXT **)&local_68);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_viewport_depth_clip_control
                    (local_60,(Value *)this_00,
                     (VkPipelineViewportDepthClipControlCreateInfoEXT **)&local_68);
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT)
          goto LAB_0011e971;
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_multisampled_render_to_single_sampled
                    (local_60,(Value *)this_00,
                     (VkMultisampledRenderToSingleSampledInfoEXT **)&local_68);
        }
      }
      else if ((int)VVar1 < 0x3ba1c711) {
        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_color_write(local_60,(Value *)this_00,
                            (VkPipelineColorWriteCreateInfoEXT **)&local_68);
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT)
          goto LAB_0011e971;
          local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
          parse_sampler_border_color_component_mapping
                    (local_60,(Value *)this_00,
                     (VkSamplerBorderColorComponentMappingCreateInfoEXT **)&local_68);
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
        local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
        parse_render_pass_creation_control
                  (local_60,(Value *)this_00,(VkRenderPassCreationControlEXT **)&local_68);
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
        local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
        parse_pipeline_create_flags2
                  (local_60,(Value *)this_00,(VkPipelineCreateFlags2CreateInfoKHR **)&local_68);
      }
      else {
        if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT)
        goto LAB_0011e971;
        local_68 = (VkSamplerYcbcrConversionCreateInfo *)0x0;
        parse_depth_clamp_control
                  (local_60,(Value *)this_00,
                   (VkPipelineViewportDepthClampControlCreateInfoEXT **)&local_68);
      }
      pVVar2 = local_68;
      local_68->sType = VVar1;
      local_68->pNext = (void *)0x0;
      pVVar7 = local_68;
      if (pVVar6 != (VkSamplerYcbcrConversionCreateInfo *)0x0) {
        pVVar6->pNext = local_68;
        pVVar7 = pVVar8;
      }
      this_00 = this_00 + 0x10;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(pnext);
      pVVar6 = pVVar2;
      pVVar8 = pVVar7;
    } while (this_00 != pGVar4);
  }
  *local_38 = pVVar7;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pnext_chain(
		const Value &pnext, const void **outpNext,
		StateCreatorInterface *iface, DatabaseInterface *resolver,
		const Value *pipelines)
{
	VkBaseInStructure *ret = nullptr;
	VkBaseInStructure *chain = nullptr;

	for (auto itr = pnext.Begin(); itr != pnext.End(); ++itr)
	{
		auto &next = *itr;
		auto sType = static_cast<VkStructureType>(next["sType"].GetInt());
		VkBaseInStructure *new_struct = nullptr;

		switch (sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
		{
			VkPipelineTessellationDomainOriginStateCreateInfo *info = nullptr;
			if (!parse_tessellation_domain_origin_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			VkPipelineVertexInputDivisorStateCreateInfoKHR *info = nullptr;
			if (!parse_vertex_input_divisor_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationDepthClipStateCreateInfoEXT *info = nullptr;
			if (!parse_rasterization_depth_clip_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationStateStreamCreateInfoEXT *info = nullptr;
			if (!parse_rasterization_stream_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			VkRenderPassMultiviewCreateInfo *info = nullptr;
			if (!parse_multiview_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *info = nullptr;
			if (!parse_descriptor_set_binding_flags(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
		{
			VkPipelineColorBlendAdvancedStateCreateInfoEXT *info = nullptr;
			if (!parse_color_blend_advanced_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationConservativeStateCreateInfoEXT *info = nullptr;
			if (!parse_rasterization_conservative_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			VkPipelineRasterizationLineStateCreateInfoKHR *info = nullptr;
			if (!parse_rasterization_line_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
		{
			VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *info = nullptr;
			if (!parse_shader_stage_required_subgroup_size(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			VkMutableDescriptorTypeCreateInfoEXT *info = nullptr;
			if (!parse_mutable_descriptor_type(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			VkAttachmentDescriptionStencilLayout *info = nullptr;
			if (!parse_attachment_description_stencil_layout(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			VkAttachmentReferenceStencilLayout *info = nullptr;
			if (!parse_attachment_reference_stencil_layout(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			VkSubpassDescriptionDepthStencilResolve *resolve = nullptr;
			if (!parse_subpass_description_depth_stencil_resolve(next, &resolve))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(resolve);
			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			VkFragmentShadingRateAttachmentInfoKHR *rate = nullptr;
			if (!parse_fragment_shading_rate_attachment_info(next, &rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(rate);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			VkPipelineRenderingCreateInfoKHR *rendering = nullptr;
			if (!parse_pipeline_rendering_info(next, &rendering))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(rendering);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			VkPipelineColorWriteCreateInfoEXT *color_write = nullptr;
			if (!parse_color_write(next, &color_write))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(color_write);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			VkPipelineSampleLocationsStateCreateInfoEXT *sample_locations = nullptr;
			if (!parse_sample_locations(next, &sample_locations))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(sample_locations);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *provoking_vertex = nullptr;
			if (!parse_provoking_vertex(next, &provoking_vertex))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(provoking_vertex);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			VkSamplerCustomBorderColorCreateInfoEXT *custom_border_color = nullptr;
			if (!parse_sampler_custom_border_color(next, &custom_border_color))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(custom_border_color);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			VkSamplerReductionModeCreateInfo *reduction_mode = nullptr;
			if (!parse_sampler_reduction_mode(next, &reduction_mode))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(reduction_mode);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			VkRenderPassInputAttachmentAspectCreateInfo *input_att = nullptr;
			if (!parse_input_attachment_aspect(next, &input_att))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(input_att);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			VkPipelineDiscardRectangleStateCreateInfoEXT *discard_rectangles = nullptr;
			if (!parse_discard_rectangles(next, &discard_rectangles))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(discard_rectangles);
			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			VkMemoryBarrier2KHR *memory_barrier2 = nullptr;
			if (!parse_memory_barrier2(next, &memory_barrier2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(memory_barrier2);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			VkPipelineFragmentShadingRateStateCreateInfoKHR *fragment_shading_rate = nullptr;
			if (!parse_fragment_shading_rate(next, &fragment_shading_rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			VkSamplerYcbcrConversionCreateInfo *conv = nullptr;
			if (!parse_sampler_ycbcr_conversion(next, &conv))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(conv);
			break;
		}

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			VkGraphicsPipelineLibraryCreateInfoEXT *graphics_pipeline_library = nullptr;
			if (!parse_graphics_pipeline_library(next, &graphics_pipeline_library))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(graphics_pipeline_library);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		{
			VkPipelineLibraryCreateInfoKHR *library = nullptr;
			if (!iface || !pipelines)
				return false;
			if (!parse_pipeline_library(*iface, resolver, *pipelines, next, RESOURCE_GRAPHICS_PIPELINE, &library))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(library);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			VkPipelineViewportDepthClipControlCreateInfoEXT *clip = nullptr;
			if (!parse_viewport_depth_clip_control(next, &clip))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(clip);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
		{
			VkPipelineCreateFlags2CreateInfoKHR *flags2 = nullptr;
			if (!parse_pipeline_create_flags2(next, &flags2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(flags2);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
		{
			VkRenderPassCreationControlEXT *info = nullptr;
			if (!parse_render_pass_creation_control(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
		{
			VkSamplerBorderColorComponentMappingCreateInfoEXT *info = nullptr;
			if (!parse_sampler_border_color_component_mapping(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
		{
			VkMultisampledRenderToSingleSampledInfoEXT *info = nullptr;
			if (!parse_multisampled_render_to_single_sampled(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			VkDepthBiasRepresentationInfoEXT *info = nullptr;
			if (!parse_depth_bias_representation(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
		{
			VkRenderPassFragmentDensityMapCreateInfoEXT *info = nullptr;
			if (!parse_render_pass_fragment_density_map(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
		{
			VkSampleLocationsInfoEXT *info = nullptr;
			if (!parse_sample_locations_info(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			VkPipelineRobustnessCreateInfoEXT *info = nullptr;
			if (!parse_pipeline_robustness(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
		{
			VkPipelineViewportDepthClampControlCreateInfoEXT *info = nullptr;
			if (!parse_depth_clamp_control(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		{
			VkRenderingAttachmentLocationInfoKHR *info = nullptr;
			if (!parse_rendering_attachment_location_info(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			VkRenderingInputAttachmentIndexInfoKHR *info = nullptr;
			if (!parse_rendering_input_attachment_index_info(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		default:
			LOGE_LEVEL("Failed to parse pNext chain for sType: %d\n", int(sType));
			return false;
		}

		new_struct->sType = sType;
		new_struct->pNext = nullptr;

		if (!chain)
		{
			chain = new_struct;
			ret = chain;
		}
		else
		{
			chain->pNext = new_struct;
			chain = new_struct;
		}
	}

	*outpNext = ret;
	return true;
}